

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Crop *in_RDI;
  int *_hoffset_00;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *this_00;
  Mat *this_01;
  int *_outd_00;
  Mat *in_stack_fffffffffffffb98;
  Mat *dst;
  int in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba4;
  undefined1 in_stack_fffffffffffffba5;
  undefined1 in_stack_fffffffffffffba6;
  undefined1 in_stack_fffffffffffffba7;
  Mat *in_stack_fffffffffffffba8;
  int local_328;
  int local_324;
  Mat local_320;
  undefined1 local_2d8 [216];
  int local_200;
  undefined4 local_1fc;
  Mat local_1f8;
  undefined1 local_1b0 [72];
  Mat local_168;
  Mat local_120;
  Mat local_c8;
  undefined1 local_80 [12];
  undefined1 local_74 [68];
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_74._60_8_ = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_74._56_4_ = local_30->w;
  local_74._52_4_ = local_30->h;
  local_74._48_4_ = local_30->d;
  local_74._44_4_ = local_30->c;
  local_74._40_4_ = local_30->dims;
  local_74._28_8_ = local_30->elemsize;
  local_74._20_8_ = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  local_74._4_4_ = 0xffffffff;
  local_74._0_4_ = -1;
  local_80._8_4_ = -1;
  local_80._4_4_ = -1;
  if (in_RDI->woffset == -0xe9) {
    ncnn::Mat::shape(in_stack_fffffffffffffb98);
    in_stack_fffffffffffffba8 = (Mat *)ncnn::Mat::operator_cast_to_int_((Mat *)local_74._60_8_);
    dst = (Mat *)local_80;
    _outd_00 = (int *)(local_80 + 4);
    this_01 = (Mat *)(local_80 + 8);
    this_00 = (Mat *)local_74;
    _hoffset_00 = (int *)(local_74 + 0xc);
    resolve_crop_roi(in_RDI,&local_c8,(int *)in_stack_fffffffffffffba8,(int *)(local_74 + 0x10),
                     _hoffset_00,(int *)(local_74 + 8),(int *)(local_74 + 4),(int *)this_00,
                     (int *)this_01,_outd_00,(int *)dst);
    ncnn::Mat::~Mat((Mat *)0x36dcf7);
  }
  else {
    ncnn::Mat::shape(in_stack_fffffffffffffb98);
    ncnn::Mat::shape(in_stack_fffffffffffffb98);
    dst = (Mat *)local_80;
    _outd_00 = (int *)(local_80 + 4);
    this_01 = (Mat *)(local_80 + 8);
    this_00 = (Mat *)local_74;
    _hoffset_00 = (int *)(local_74 + 0xc);
    resolve_crop_roi(in_RDI,&local_120,&local_168,(int *)(local_74 + 0x10),_hoffset_00,
                     (int *)(local_74 + 8),(int *)(local_74 + 4),(int *)this_00,(int *)this_01,
                     _outd_00,(int *)dst);
    ncnn::Mat::~Mat((Mat *)0x36ddcd);
    ncnn::Mat::~Mat((Mat *)0x36ddda);
  }
  iVar3 = (int)((ulong)dst >> 0x20);
  if (local_74._40_4_ == 1) {
    if (local_74._0_4_ == local_74._56_4_) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      ncnn::Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                        CONCAT16(in_stack_fffffffffffffba6,
                                                 CONCAT15(in_stack_fffffffffffffba5,
                                                          CONCAT14(in_stack_fffffffffffffba4,
                                                                   in_stack_fffffffffffffba0)))),
                        iVar3,(size_t)_outd_00,(Allocator *)this_01);
      bVar1 = ncnn::Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_74._28_8_ == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        if (local_74._28_8_ == 2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        if (local_74._28_8_ == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_74._40_4_ == 2) {
    if ((local_74._0_4_ == local_74._56_4_) && (local_80._8_4_ == local_74._52_4_)) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      ncnn::Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                        CONCAT16(in_stack_fffffffffffffba6,
                                                 CONCAT15(in_stack_fffffffffffffba5,
                                                          CONCAT14(in_stack_fffffffffffffba4,
                                                                   in_stack_fffffffffffffba0)))),
                        iVar3,(int)dst,(size_t)_outd_00,(Allocator *)this_01);
      bVar1 = ncnn::Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_74._28_8_ == 1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        if (local_74._28_8_ == 2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        if (local_74._28_8_ == 4) {
          copy_cut_border_image<float>
                    ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                     CONCAT16(in_stack_fffffffffffffba6,
                                              CONCAT15(in_stack_fffffffffffffba5,
                                                       CONCAT14(in_stack_fffffffffffffba4,
                                                                in_stack_fffffffffffffba0)))),dst,
                     (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_74._40_4_ == 3) {
    if (((local_74._0_4_ == local_74._56_4_) && (local_80._8_4_ == local_74._52_4_)) &&
       (local_80._0_4_ == local_74._44_4_)) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      iVar3 = local_80._0_4_;
      ncnn::Mat::channel_range
                (in_stack_fffffffffffffba8,
                 CONCAT13(in_stack_fffffffffffffba7,
                          CONCAT12(in_stack_fffffffffffffba6,
                                   CONCAT11(in_stack_fffffffffffffba5,in_stack_fffffffffffffba4))),
                 in_stack_fffffffffffffba0);
      if ((local_74._0_4_ == local_74._56_4_) && (local_80._8_4_ == local_74._52_4_)) {
        ncnn::Mat::clone(&local_1f8,(__fn *)local_1b0,(void *)0x0,iVar3,_hoffset_00);
        ncnn::Mat::operator=(this_01,this_00);
        ncnn::Mat::~Mat((Mat *)0x36e16a);
        bVar1 = ncnn::Mat::empty(this_00);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                          CONCAT16(in_stack_fffffffffffffba6,
                                                   CONCAT15(in_stack_fffffffffffffba5,
                                                            CONCAT14(in_stack_fffffffffffffba4,
                                                                     in_stack_fffffffffffffba0)))),
                          (int)((ulong)dst >> 0x20),(int)dst,(int)((ulong)_outd_00 >> 0x20),
                          (size_t)this_01,(Allocator *)this_00);
        uVar2 = ncnn::Mat::empty(this_00);
        if ((bool)uVar2) {
          local_4 = -100;
        }
        else {
          for (local_200 = 0; local_200 < (int)local_80._0_4_; local_200 = local_200 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffffba8,
                               CONCAT13(in_stack_fffffffffffffba7,
                                        CONCAT12(uVar2,CONCAT11(in_stack_fffffffffffffba5,
                                                                in_stack_fffffffffffffba4))));
            ncnn::Mat::channel(in_stack_fffffffffffffba8,
                               CONCAT13(in_stack_fffffffffffffba7,
                                        CONCAT12(uVar2,CONCAT11(in_stack_fffffffffffffba5,
                                                                in_stack_fffffffffffffba4))));
            if (local_74._28_8_ == 1) {
              copy_cut_border_image<signed_char>
                        ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffba5,
                                                                 CONCAT14(in_stack_fffffffffffffba4,
                                                                          in_stack_fffffffffffffba0)
                                                                ))),dst,
                         (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
            }
            if (local_74._28_8_ == 2) {
              copy_cut_border_image<unsigned_short>
                        ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffba5,
                                                                 CONCAT14(in_stack_fffffffffffffba4,
                                                                          in_stack_fffffffffffffba0)
                                                                ))),dst,
                         (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
            }
            if (local_74._28_8_ == 4) {
              copy_cut_border_image<float>
                        ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                         CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffba5,
                                                                 CONCAT14(in_stack_fffffffffffffba4,
                                                                          in_stack_fffffffffffffba0)
                                                                ))),dst,
                         (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
            }
            ncnn::Mat::~Mat((Mat *)0x36e3a9);
            ncnn::Mat::~Mat((Mat *)0x36e3b6);
          }
          local_4 = 0;
        }
      }
      local_1fc = 1;
      ncnn::Mat::~Mat((Mat *)0x36e3fe);
    }
  }
  else if (local_74._40_4_ == 4) {
    if ((((local_74._0_4_ == local_74._56_4_) && (local_80._8_4_ == local_74._52_4_)) &&
        (local_80._4_4_ == local_74._48_4_)) && (local_80._0_4_ == local_74._44_4_)) {
      ncnn::Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      iVar3 = local_80._0_4_;
      ncnn::Mat::channel_range
                (in_stack_fffffffffffffba8,
                 CONCAT13(in_stack_fffffffffffffba7,
                          CONCAT12(in_stack_fffffffffffffba6,
                                   CONCAT11(in_stack_fffffffffffffba5,in_stack_fffffffffffffba4))),
                 in_stack_fffffffffffffba0);
      if (((local_74._0_4_ == local_74._56_4_) && (local_80._8_4_ == local_74._52_4_)) &&
         (local_80._4_4_ == local_74._48_4_)) {
        ncnn::Mat::clone(&local_320,(__fn *)local_2d8,(void *)0x0,iVar3,_hoffset_00);
        ncnn::Mat::operator=(this_01,this_00);
        ncnn::Mat::~Mat((Mat *)0x36e526);
        bVar1 = ncnn::Mat::empty(this_00);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        ncnn::Mat::create((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                          CONCAT16(in_stack_fffffffffffffba6,
                                                   CONCAT15(in_stack_fffffffffffffba5,
                                                            CONCAT14(in_stack_fffffffffffffba4,
                                                                     in_stack_fffffffffffffba0)))),
                          (int)((ulong)dst >> 0x20),(int)dst,(int)((ulong)_outd_00 >> 0x20),
                          (int)_outd_00,(size_t)this_01,(Allocator *)in_RDI);
        uVar2 = ncnn::Mat::empty(this_00);
        if ((bool)uVar2) {
          local_4 = -100;
        }
        else {
          for (local_324 = 0; local_324 < (int)local_80._0_4_; local_324 = local_324 + 1) {
            for (local_328 = 0; local_328 < (int)local_80._4_4_; local_328 = local_328 + 1) {
              ncnn::Mat::channel(in_stack_fffffffffffffba8,
                                 CONCAT13(in_stack_fffffffffffffba7,
                                          CONCAT12(in_stack_fffffffffffffba6,
                                                   CONCAT11(in_stack_fffffffffffffba5,uVar2))));
              ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
              ncnn::Mat::~Mat((Mat *)0x36e6c6);
              ncnn::Mat::channel(in_stack_fffffffffffffba8,
                                 CONCAT13(in_stack_fffffffffffffba7,
                                          CONCAT12(in_stack_fffffffffffffba6,
                                                   CONCAT11(in_stack_fffffffffffffba5,uVar2))));
              ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
              ncnn::Mat::~Mat((Mat *)0x36e706);
              if (local_74._28_8_ == 1) {
                copy_cut_border_image<signed_char>
                          ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                           CONCAT16(in_stack_fffffffffffffba6,
                                                    CONCAT15(in_stack_fffffffffffffba5,
                                                             CONCAT14(uVar2,
                                                  in_stack_fffffffffffffba0)))),dst,
                           (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
              }
              if (local_74._28_8_ == 2) {
                copy_cut_border_image<unsigned_short>
                          ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                           CONCAT16(in_stack_fffffffffffffba6,
                                                    CONCAT15(in_stack_fffffffffffffba5,
                                                             CONCAT14(uVar2,
                                                  in_stack_fffffffffffffba0)))),dst,
                           (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
              }
              if (local_74._28_8_ == 4) {
                copy_cut_border_image<float>
                          ((Mat *)CONCAT17(in_stack_fffffffffffffba7,
                                           CONCAT16(in_stack_fffffffffffffba6,
                                                    CONCAT15(in_stack_fffffffffffffba5,
                                                             CONCAT14(uVar2,
                                                  in_stack_fffffffffffffba0)))),dst,
                           (int)((ulong)_outd_00 >> 0x20),(int)_outd_00);
              }
              ncnn::Mat::~Mat((Mat *)0x36e838);
              ncnn::Mat::~Mat((Mat *)0x36e845);
            }
          }
          local_4 = 0;
        }
      }
      local_1fc = 1;
      ncnn::Mat::~Mat((Mat *)0x36e8a5);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}